

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_test.cpp
# Opt level: O3

void PrintTreeWith1Level(BPlusTree *bplustree)

{
  pointer *ppsVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer psVar3;
  ulong uVar4;
  long lVar5;
  shared_ptr<Node> local_68;
  shared_ptr<Node> local_58;
  BPlusTree *local_48;
  element_type *local_40;
  shared_ptr<Node> root;
  
  local_48 = bplustree;
  BPlusTree::GetRoot(bplustree);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Root Node: ",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  local_68.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40;
  local_68.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ppsVar1 = &((root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ptrs).
                 super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *(int *)ppsVar1 = *(int *)ppsVar1 + 1;
      UNLOCK();
    }
    else {
      ppsVar1 = &((root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ptrs).
                 super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *(int *)ppsVar1 = *(int *)ppsVar1 + 1;
    }
  }
  BPlusTree::PrintNode(local_48,&local_68);
  if ((element_type *)
      local_68.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  psVar3 = (local_40->ptrs).
           super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((local_40->ptrs).
      super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>._M_impl.
      super__Vector_impl_data._M_finish != psVar3) {
    lVar5 = 8;
    uVar4 = 0;
    do {
      peVar2 = *(element_type **)((long)psVar3 + lVar5 + -8);
      this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&(psVar3->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar5)
      ;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"level 1 node: ",0xe)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      local_58.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
      local_58.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this;
      BPlusTree::PrintNode(local_48,&local_58);
      if (local_58.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      uVar4 = uVar4 + 1;
      psVar3 = (local_40->ptrs).
               super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < (ulong)((long)(local_40->ptrs).
                                   super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4));
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  if (root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void PrintTreeWith1Level(BPlusTree& bplustree) {
	std::shared_ptr<Node> root = bplustree.GetRoot();
	std::cerr << "Root Node: " << std::endl;
	bplustree.PrintNode(root);

	for (int i = 0; i < root->ptrs.size(); i++) {
		std::shared_ptr<Node> itr = std::static_pointer_cast<Node>(root->ptrs[i]);
		std::cerr << "level 1 node: " << std::endl;
		bplustree.PrintNode(itr);
	}
	std::cerr << std::endl;
}